

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall aiMesh::aiMesh(aiMesh *this)

{
  uint local_18;
  uint local_14;
  uint a_1;
  uint a;
  aiMesh *this_local;
  
  this->mPrimitiveTypes = 0;
  this->mNumVertices = 0;
  this->mNumFaces = 0;
  this->mVertices = (aiVector3D *)0x0;
  this->mNormals = (aiVector3D *)0x0;
  this->mTangents = (aiVector3D *)0x0;
  this->mBitangents = (aiVector3D *)0x0;
  this->mColors[6] = (aiColor4D *)0x0;
  this->mColors[7] = (aiColor4D *)0x0;
  this->mColors[4] = (aiColor4D *)0x0;
  this->mColors[5] = (aiColor4D *)0x0;
  this->mColors[2] = (aiColor4D *)0x0;
  this->mColors[3] = (aiColor4D *)0x0;
  this->mColors[0] = (aiColor4D *)0x0;
  this->mColors[1] = (aiColor4D *)0x0;
  this->mTextureCoords[6] = (aiVector3D *)0x0;
  this->mTextureCoords[7] = (aiVector3D *)0x0;
  this->mTextureCoords[4] = (aiVector3D *)0x0;
  this->mTextureCoords[5] = (aiVector3D *)0x0;
  this->mTextureCoords[2] = (aiVector3D *)0x0;
  this->mTextureCoords[3] = (aiVector3D *)0x0;
  this->mTextureCoords[0] = (aiVector3D *)0x0;
  this->mTextureCoords[1] = (aiVector3D *)0x0;
  this->mNumUVComponents[4] = 0;
  this->mNumUVComponents[5] = 0;
  this->mNumUVComponents[6] = 0;
  this->mNumUVComponents[7] = 0;
  this->mNumUVComponents[0] = 0;
  this->mNumUVComponents[1] = 0;
  this->mNumUVComponents[2] = 0;
  this->mNumUVComponents[3] = 0;
  this->mFaces = (aiFace *)0x0;
  this->mNumBones = 0;
  this->mBones = (aiBone **)0x0;
  this->mMaterialIndex = 0;
  aiString::aiString(&this->mName);
  this->mNumAnimMeshes = 0;
  this->mAnimMeshes = (aiAnimMesh **)0x0;
  this->mMethod = 0;
  aiAABB::aiAABB(&this->mAABB);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    this->mNumUVComponents[local_14] = 0;
    this->mTextureCoords[local_14] = (aiVector3D *)0x0;
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    this->mColors[local_18] = (aiColor4D *)0x0;
  }
  return;
}

Assistant:

aiMesh() AI_NO_EXCEPT
    : mPrimitiveTypes( 0 )
    , mNumVertices( 0 )
    , mNumFaces( 0 )
    , mVertices( nullptr )
    , mNormals(nullptr)
    , mTangents(nullptr)
    , mBitangents(nullptr)
    , mColors()
    , mTextureCoords()
    , mNumUVComponents()
    , mFaces(nullptr)
    , mNumBones( 0 )
    , mBones(nullptr)
    , mMaterialIndex( 0 )
    , mNumAnimMeshes( 0 )
    , mAnimMeshes(nullptr)
    , mMethod( 0 )
    , mAABB() {
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a ) {
            mNumUVComponents[a] = 0;
            mTextureCoords[a] = nullptr;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
            mColors[a] = nullptr;
        }
    }